

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O3

int mbedtls_x509_get_time(uchar **p,uchar *end,mbedtls_x509_time *tm)

{
  uchar *puVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  byte *pbVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  size_t local_30;
  size_t len;
  
  puVar1 = *p;
  if (end == puVar1 || (long)end - (long)puVar1 < 0) {
    return -0x2460;
  }
  if (*puVar1 == '\x17') {
    bVar2 = false;
    lVar13 = 2;
  }
  else {
    if (*puVar1 != '\x18') {
      return -0x2462;
    }
    lVar13 = 4;
    bVar2 = true;
  }
  *p = puVar1 + 1;
  iVar3 = mbedtls_asn1_get_len(p,end,&local_30);
  if (iVar3 == 0) {
    if (local_30 == lVar13 + 10U) {
      pbVar5 = *p;
    }
    else {
      if (local_30 != lVar13 + 0xbU) {
        return -0x2400;
      }
      pbVar5 = *p;
      if (pbVar5[local_30 - 1] != 0x5a) {
        return -0x2400;
      }
    }
    *p = pbVar5 + local_30;
    uVar8 = (pbVar5[1] - 0x30) + (*pbVar5 - 0x30) * 10;
    uVar7 = 0xffffffff;
    if (pbVar5[1] - 0x30 < 10) {
      uVar7 = uVar8;
    }
    if (9 < *pbVar5 - 0x30) {
      uVar7 = 0xffffffff;
    }
    tm->year = uVar7;
    iVar3 = -0x2400;
    if (-1 < (int)uVar7) {
      if (bVar2) {
        uVar8 = (pbVar5[3] - 0x30) + (pbVar5[2] - 0x30) * 10;
        uVar10 = 0xffffffff;
        if (pbVar5[3] - 0x30 < 10) {
          uVar10 = uVar8;
        }
        if (9 < pbVar5[2] - 0x30) {
          uVar10 = 0xffffffff;
        }
        tm->year = uVar10;
        if ((int)uVar10 < 0) {
          return -0x2400;
        }
        iVar6 = uVar7 * 100;
        pbVar5 = pbVar5 + 2;
      }
      else {
        iVar6 = 0x76c;
        if (uVar7 < 0x32) {
          iVar6 = 2000;
        }
      }
      uVar7 = iVar6 + uVar8;
      tm->year = uVar7;
      uVar10 = (pbVar5[3] - 0x30) + (pbVar5[2] - 0x30) * 10;
      if (9 < pbVar5[3] - 0x30) {
        uVar10 = 0xffffffff;
      }
      if (9 < pbVar5[2] - 0x30) {
        uVar10 = 0xffffffff;
      }
      tm->mon = uVar10;
      iVar6 = (pbVar5[5] - 0x30) + (pbVar5[4] - 0x30) * 10;
      if (9 < pbVar5[5] - 0x30) {
        iVar6 = -1;
      }
      if (9 < pbVar5[4] - 0x30) {
        iVar6 = -1;
      }
      tm->day = iVar6;
      uVar9 = (pbVar5[7] - 0x30) + (pbVar5[6] - 0x30) * 10;
      if (9 < pbVar5[7] - 0x30) {
        uVar9 = 0xffffffff;
      }
      if (9 < pbVar5[6] - 0x30) {
        uVar9 = 0xffffffff;
      }
      tm->hour = uVar9;
      uVar11 = (pbVar5[9] - 0x30) + (pbVar5[8] - 0x30) * 10;
      if (9 < pbVar5[9] - 0x30) {
        uVar11 = 0xffffffff;
      }
      if (9 < pbVar5[8] - 0x30) {
        uVar11 = 0xffffffff;
      }
      tm->min = uVar11;
      uVar4 = (pbVar5[0xb] - 0x30) + (pbVar5[10] - 0x30) * 10;
      if (9 < pbVar5[0xb] - 0x30) {
        uVar4 = 0xffffffff;
      }
      if (9 < pbVar5[10] - 0x30) {
        uVar4 = 0xffffffff;
      }
      tm->sec = uVar4;
      if (uVar10 < 0xd) {
        uVar12 = 0x1f;
        if ((0x15aaU >> (uVar10 & 0x1f) & 1) == 0) {
          if ((0xa50U >> (uVar10 & 0x1f) & 1) == 0) {
            if (uVar10 != 2) {
              return -0x2400;
            }
            uVar12 = 0x1c;
            if ((uVar8 & 3) == 0) {
              uVar12 = 0x1d;
              if ((uVar7 * -0x3d70a3d7 >> 2 | uVar8 * 0x40000000) < 0x28f5c29) {
                uVar12 = ((uVar7 * -0x3d70a3d7 >> 4 | uVar7 * -0x70000000) < 0xa3d70b) + 0x1c;
              }
            }
          }
          else {
            uVar12 = 0x1e;
          }
        }
        if ((((iVar6 - 1U < uVar12) && (uVar7 < 10000)) && (uVar9 < 0x18)) && (uVar11 < 0x3c)) {
          iVar3 = -0x2400;
          if (uVar4 < 0x3c) {
            iVar3 = 0;
          }
        }
      }
    }
  }
  else {
    iVar3 = iVar3 + -0x2400;
  }
  return iVar3;
}

Assistant:

int mbedtls_x509_get_time(unsigned char **p, const unsigned char *end,
                          mbedtls_x509_time *tm)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len, year_len;
    unsigned char tag;

    if ((end - *p) < 1) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_DATE,
                                 MBEDTLS_ERR_ASN1_OUT_OF_DATA);
    }

    tag = **p;

    if (tag == MBEDTLS_ASN1_UTC_TIME) {
        year_len = 2;
    } else if (tag == MBEDTLS_ASN1_GENERALIZED_TIME) {
        year_len = 4;
    } else {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_DATE,
                                 MBEDTLS_ERR_ASN1_UNEXPECTED_TAG);
    }

    (*p)++;
    ret = mbedtls_asn1_get_len(p, end, &len);

    if (ret != 0) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_DATE, ret);
    }

    /* len is 12 or 14 depending on year_len, plus optional trailing 'Z' */
    if (len != year_len + 10 &&
        !(len == year_len + 11 && (*p)[(len - 1)] == 'Z')) {
        return MBEDTLS_ERR_X509_INVALID_DATE;
    }

    (*p) += len;
    return x509_parse_time(*p - len, tm, year_len);
}